

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::ValidateRegValue
          (InterpreterStackFrame *this,Var value,bool allowStackVar,
          bool allowStackVarOnDisabledStackNestedFunc)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  StackScriptFunction *pSVar4;
  undefined4 *puVar5;
  
  if (value == (Var)0x0) {
    return;
  }
  bVar2 = VarIs<Js::RecyclableObject>(value);
  if (!bVar2) {
    return;
  }
  if ((((!allowStackVar) || ((*(byte *)(*(long *)(this + 0x88) + 0x48) & 1) == 0)) &&
      (bVar2 = ThreadContext::IsOnStack(value), bVar2)) &&
     ((!allowStackVar || !allowStackVarOnDisabledStackNestedFunc ||
      (pSVar4 = VarTo<Js::StackScriptFunction>(value),
      pSVar4->boxedScriptFunction == (ScriptFunction *)0x0)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1ef8,
                                "(!ThreadContext::IsOnStack(value) || (allowStackVar && allowStackVarOnDisabledStackNestedFunc && StackScriptFunction::IsBoxed(value)))"
                                ,
                                "!ThreadContext::IsOnStack(value) || (allowStackVar && allowStackVarOnDisabledStackNestedFunc && StackScriptFunction::IsBoxed(value))"
                               );
    if (!bVar2) goto LAB_00a493b8;
    *puVar5 = 0;
  }
  BVar3 = CrossSite::NeedMarshalVar(value,*(ScriptContext **)(this + 0x78));
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1efa,"(!CrossSite::NeedMarshalVar(value, GetScriptContext()))",
                                "!CrossSite::NeedMarshalVar(value, GetScriptContext())");
    if (!bVar2) {
LAB_00a493b8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void InterpreterStackFrame::ValidateRegValue(Var value, bool allowStackVar, bool allowStackVarOnDisabledStackNestedFunc) const
    {
#if DBG
        if (value != nullptr && !TaggedNumber::Is(value))
        {
            if (!allowStackVar || !this->m_functionBody->DoStackNestedFunc())
            {
                Assert(!ThreadContext::IsOnStack(value)
                    || (allowStackVar && allowStackVarOnDisabledStackNestedFunc && StackScriptFunction::IsBoxed(value)));
            }
            Assert(!CrossSite::NeedMarshalVar(value, GetScriptContext()));
        }
#endif
    }